

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O0

void Timidity::convert_sample_data(Sample *sp,void *data)

{
  int iVar1;
  int local_5c;
  int c_2;
  int i_3;
  WORD *cp_3;
  int c_1;
  int i_2;
  SWORD *cp_2;
  int c;
  int i_1;
  BYTE *cp_1;
  int i;
  SBYTE *cp;
  sample_t *newdata;
  void *data_local;
  Sample *sp_local;
  
  cp = (SBYTE *)0x0;
  switch(sp->modes & 3) {
  case 0:
    cp = (SBYTE *)safe_malloc((long)(sp->data_length + 1) << 2);
    for (cp_1._4_4_ = 0; cp_1._4_4_ < sp->data_length; cp_1._4_4_ = cp_1._4_4_ + 1) {
      if (*(char *)((long)data + (long)cp_1._4_4_) < '\0') {
        *(float *)(cp + (long)cp_1._4_4_ * 4) =
             (float)(int)*(char *)((long)data + (long)cp_1._4_4_) / 128.0;
      }
      else {
        *(float *)(cp + (long)cp_1._4_4_ * 4) =
             (float)(int)*(char *)((long)data + (long)cp_1._4_4_) / 127.0;
      }
    }
    break;
  case 1:
    sp->data_length = sp->data_length >> 1;
    sp->loop_start = sp->loop_start >> 1;
    sp->loop_end = sp->loop_end >> 1;
    cp = (SBYTE *)safe_malloc((long)(sp->data_length + 1) << 2);
    for (cp_3._4_4_ = 0; cp_3._4_4_ < sp->data_length; cp_3._4_4_ = cp_3._4_4_ + 1) {
      iVar1 = (int)*(short *)((long)data + (long)cp_3._4_4_ * 2);
      if (iVar1 < 0) {
        *(float *)(cp + (long)cp_3._4_4_ * 4) = (float)iVar1 / 32768.0;
      }
      else {
        *(float *)(cp + (long)cp_3._4_4_ * 4) = (float)iVar1 / 32767.0;
      }
    }
    break;
  case 2:
    cp = (SBYTE *)safe_malloc((long)(sp->data_length + 1) << 2);
    for (cp_2._4_4_ = 0; cp_2._4_4_ < sp->data_length; cp_2._4_4_ = cp_2._4_4_ + 1) {
      iVar1 = *(byte *)((long)data + (long)cp_2._4_4_) - 0x80;
      if (iVar1 < 0) {
        *(float *)(cp + (long)cp_2._4_4_ * 4) = (float)iVar1 / 128.0;
      }
      else {
        *(float *)(cp + (long)cp_2._4_4_ * 4) = (float)iVar1 / 127.0;
      }
    }
    break;
  case 3:
    sp->data_length = sp->data_length >> 1;
    sp->loop_start = sp->loop_start >> 1;
    sp->loop_end = sp->loop_end >> 1;
    cp = (SBYTE *)safe_malloc((long)(sp->data_length + 1) << 2);
    for (local_5c = 0; local_5c < sp->data_length; local_5c = local_5c + 1) {
      iVar1 = *(ushort *)((long)data + (long)local_5c * 2) - 0x8000;
      if (iVar1 < 0) {
        *(float *)(cp + (long)local_5c * 4) = (float)iVar1 / 32768.0;
      }
      else {
        *(float *)(cp + (long)local_5c * 4) = (float)iVar1 / 32767.0;
      }
    }
  }
  *(undefined4 *)(cp + (long)sp->data_length * 4) =
       *(undefined4 *)(cp + (long)(sp->data_length + -1) * 4);
  if (sp->data != (sample_t *)0x0) {
    free(sp->data);
  }
  sp->data = (sample_t *)cp;
  return;
}

Assistant:

void convert_sample_data(Sample *sp, const void *data)
{
	/* convert everything to 32-bit floating point data */
	sample_t *newdata = NULL;

	switch (sp->modes & (PATCH_16 | PATCH_UNSIGNED))
	{
	case 0:
	  {					/* 8-bit, signed */
		SBYTE *cp = (SBYTE *)data;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			if (cp[i] < 0)
			{
				newdata[i] = float(cp[i]) / 128.f;
			}
			else
			{
				newdata[i] = float(cp[i]) / 127.f;
			}
		}
		break;
	  }

	case PATCH_UNSIGNED:
	  {					/* 8-bit, unsigned */
		BYTE *cp = (BYTE *)data;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = cp[i] - 128;
			if (c < 0)
			{
				newdata[i] = float(c) / 128.f;
			}
			else
			{
				newdata[i] = float(c) / 127.f;
			}
		}
		break;
	  }

	case PATCH_16:
	  {					/* 16-bit, signed */
		SWORD *cp = (SWORD *)data;
		/* Convert these to samples */
		sp->data_length >>= 1;
		sp->loop_start >>= 1;
		sp->loop_end >>= 1;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = LittleShort(cp[i]);
			if (c < 0)
			{
				newdata[i] = float(c) / 32768.f;
			}
			else
			{
				newdata[i] = float(c) / 32767.f;
			}
		}
		break;
	  }

	case PATCH_16 | PATCH_UNSIGNED:
	  {					/* 16-bit, unsigned */
		WORD *cp = (WORD *)data;
		/* Convert these to samples */
		sp->data_length >>= 1;
		sp->loop_start >>= 1;
		sp->loop_end >>= 1;
		newdata = (sample_t *)safe_malloc((sp->data_length + 1) * sizeof(sample_t));
		for (int i = 0; i < sp->data_length; ++i)
		{
			int c = LittleShort(cp[i]) - 32768;
			if (c < 0)
			{
				newdata[i] = float(c) / 32768.f;
			}
			else
			{
				newdata[i] = float(c) / 32767.f;
			}
		}
		break;
	  }
	}
	/* Duplicate the final sample for linear interpolation. */
	newdata[sp->data_length] = newdata[sp->data_length - 1];
	if (sp->data != NULL)
	{
		free(sp->data);
	}
	sp->data = newdata;
}